

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawSpanAddClampP_C(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE *pBVar4;
  DWORD *pDVar5;
  DWORD *pDVar6;
  lighttable_t *plVar7;
  dsfixed_t dVar8;
  dsfixed_t dVar9;
  BYTE *pBVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  dsfixed_t dVar14;
  dsfixed_t dVar15;
  uint uVar16;
  int iVar17;
  
  pBVar10 = ds_source;
  dVar9 = ds_ystep;
  dVar8 = ds_xstep;
  plVar7 = ds_colormap;
  pDVar6 = dc_destblend;
  pDVar5 = dc_srcblend;
  pBVar4 = dc_destorg;
  iVar11 = ylookup[ds_y] + ds_x1;
  iVar17 = (ds_x2 - ds_x1) + 1;
  if (ds_ybits == 6 && ds_xbits == 6) {
    lVar12 = 0;
    dVar14 = ds_xfrac;
    dVar15 = ds_yfrac;
    do {
      uVar16 = pDVar6[pBVar4[lVar12 + iVar11]] +
               pDVar5[plVar7[pBVar10[dVar15 >> 0x1a | dVar14 >> 0x14 & 0xffffffc0]]];
      uVar13 = uVar16 & 0x40100400;
      uVar13 = uVar13 - (uVar13 >> 5) | uVar16 & 0x3e0f83e0 | 0x1f07c1f;
      pBVar4[lVar12 + iVar11] = RGB32k.All[uVar13 >> 0xf & uVar13];
      dVar14 = dVar14 + dVar8;
      dVar15 = dVar15 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar17 != (int)lVar12);
  }
  else {
    bVar3 = (byte)ds_ybits;
    bVar1 = 0x20 - bVar3;
    bVar2 = (byte)ds_xbits;
    lVar12 = 0;
    dVar14 = ds_xfrac;
    dVar15 = ds_yfrac;
    do {
      uVar16 = pDVar6[pBVar4[lVar12 + iVar11]] +
               pDVar5[plVar7[pBVar10[(int)((dVar15 >> (bVar1 & 0x1f)) +
                                          (dVar14 >> (bVar1 - bVar2 & 0x1f) &
                                          ~(-1 << (bVar2 & 0x1f)) << (bVar3 & 0x1f)))]]];
      uVar13 = uVar16 & 0x40100400;
      uVar13 = uVar13 - (uVar13 >> 5) | uVar16 & 0x3e0f83e0 | 0x1f07c1f;
      pBVar4[lVar12 + iVar11] = RGB32k.All[uVar13 >> 0xf & uVar13];
      dVar14 = dVar14 + dVar8;
      dVar15 = dVar15 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar17 != (int)lVar12);
  }
  return;
}

Assistant:

void R_DrawSpanAddClampP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;
	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			DWORD a = fg2rgb[colormap[source[spot]]] + bg2rgb[*dest];
			DWORD b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest++ = RGB32k.All[a & (a>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			DWORD a = fg2rgb[colormap[source[spot]]] + bg2rgb[*dest];
			DWORD b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest++ = RGB32k.All[a & (a>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}